

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

Var * __thiscall
kratos::Generator::var
          (Generator *this,string *var_name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size,bool is_signed)

{
  uint32_t uVar1;
  iterator iVar2;
  VarException *this_00;
  undefined1 auVar3 [8];
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  Var *local_98;
  undefined1 local_90 [8];
  shared_ptr<kratos::Var> v_p;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  undefined1 local_58 [8];
  shared_ptr<kratos::Var> p;
  uint32_t local_38;
  allocator_type local_32;
  bool local_31;
  uint32_t width_local;
  bool is_signed_local;
  
  v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)size;
  local_38 = width;
  local_31 = is_signed;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
          ::find(&(this->vars_)._M_t,var_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->vars_)._M_t._M_impl.super__Rb_tree_header) {
    local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)this;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::Var>,kratos::Generator*,std::__cxx11::string_const&,unsigned_int&,std::vector<unsigned_int,std::allocator<unsigned_int>>const&,bool&>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)local_58,
               (allocator<kratos::Var> *)local_90,(Generator **)&local_78,var_name,&local_38,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
               &local_31);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
    ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::Var>&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Var>>>>
                *)&this->vars_,var_name,(shared_ptr<kratos::Var> *)local_58);
    auVar3 = local_58;
  }
  else {
    get_var((Generator *)local_90,(string *)this);
    uVar1 = (*((IRNode *)local_90)->_vptr_IRNode[7])(local_90);
    if ((uVar1 != width) ||
       (auVar3 = local_90,
       p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
            v_p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
       *(bool *)((long)local_90 + 0xf0) != is_signed)) {
      this_00 = (VarException *)__cxa_allocate_exception(0x10);
      local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)(var_name->_M_dataplus)._M_p;
      local_78.super__Vector_base<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)var_name->_M_string_length;
      format_str.size_ = 0xd;
      format_str.data_ = (char *)0x2d;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_78;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)local_58,(detail *)"redefinition of {0} with different width/sign",
                 format_str,args);
      local_98 = (Var *)local_90;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_98;
      std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
                (&local_78,__l,&local_32);
      VarException::VarException(this_00,(string *)local_58,&local_78);
      __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  if (p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               p.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  }
  return (Var *)auVar3;
}

Assistant:

Var &Generator::var(const std::string &var_name, uint32_t width, const std::vector<uint32_t> &size,
                    bool is_signed) {
    if (vars_.find(var_name) != vars_.end()) {
        auto v_p = get_var(var_name);
        if (v_p->width() != width || v_p->is_signed() != is_signed)
            throw VarException(::format("redefinition of {0} with different width/sign", var_name),
                               {v_p.get()});
        return *v_p;
    }
    auto p = std::make_shared<Var>(this, var_name, width, size, is_signed);
    vars_.emplace(var_name, p);
    return *p;
}